

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O3

void luaV_concat(lua_State *L,int total)

{
  TValue *obj;
  byte bVar1;
  lua_CFunction p_Var2;
  GCObject *pGVar3;
  ushort uVar4;
  ulong uVar5;
  TString *pTVar6;
  ushort uVar7;
  TValue *p1;
  char *pcVar8;
  StkId top;
  int iVar9;
  ulong uVar10;
  ulong l;
  char buff [40];
  char acStack_58 [40];
  
  if (total < 2) {
    __assert_fail("total >= 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                  ,0x326,"void luaV_concat(lua_State *, int)");
  }
  top = L->top;
  do {
    p1 = top + -2;
    if ((ushort)((top[-2].tt_ & 0xf) - 3) < 2) {
      uVar4 = top[-1].tt_;
      obj = top + -1;
      if ((uVar4 & 0xf) != 4) {
        if ((uVar4 & 0xf) != 3) goto LAB_001271e4;
        luaO_tostring(L,obj);
        uVar4 = top[-1].tt_;
      }
      if (uVar4 == 0x8004) {
        if (((byte)(obj->value_).f[8] & 0xf) != 4) {
          __assert_fail("(((((top - 1)->value_).gc)->tt) & 0x0F) == 4",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0x32c,"void luaV_concat(lua_State *, int)");
        }
        uVar7 = top[-2].tt_;
        if ((obj->value_).f[0xb] == (_func_int_lua_State_ptr)0x0) {
          iVar9 = 1;
          if ((uVar7 & 0xf) == 3) {
            luaO_tostring(L,p1);
          }
          goto LAB_00127392;
        }
      }
      else {
        uVar7 = top[-2].tt_;
      }
      if (uVar7 == 0x8004) {
        if (((byte)(p1->value_).f[8] & 0xf) != 4) {
          __assert_fail("(((((top - 2)->value_).gc)->tt) & 0x0F) == 4",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0x32e,"void luaV_concat(lua_State *, int)");
        }
        if ((p1->value_).f[0xb] == (_func_int_lua_State_ptr)0x0) {
          pGVar3 = top[-1].value_.gc;
          iVar9 = 1;
          top[-2].value_.gc = pGVar3;
          top[-2].tt_ = uVar4;
          if (((short)uVar4 < 0) &&
             (((uVar4 & 0x7f) != (ushort)pGVar3->tt ||
              ((pGVar3->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                          ,0x32f,"void luaV_concat(lua_State *, int)");
          }
          goto LAB_00127392;
        }
      }
      if ((uVar4 & 0xf) != 4) {
        pcVar8 = "(((((((top - 1))->tt_)) & 0x0F)) == (4))";
LAB_00127468:
        __assert_fail(pcVar8,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x333,"void luaV_concat(lua_State *, int)");
      }
      p_Var2 = (obj->value_).f;
      if (((byte)p_Var2[8] & 0xf) != 4) {
        pcVar8 = "(((((top - 1)->value_).gc)->tt) & 0x0F) == 4";
        goto LAB_00127468;
      }
      if (p_Var2[8] == (_func_int_lua_State_ptr)0x4) {
        l = (ulong)(byte)p_Var2[0xb];
      }
      else {
        l = *(ulong *)(p_Var2 + 0x10);
      }
      uVar10 = 1;
      if (1 < total) {
        uVar10 = 1;
        do {
          uVar4 = p1->tt_;
          if ((uVar4 & 0xf) != 4) {
            if ((uVar4 & 0xf) != 3) goto LAB_001272f9;
            luaO_tostring(L,p1);
            uVar4 = p1->tt_;
          }
          if ((uVar4 & 0xf) != 4) {
            pcVar8 = "(((((((top - n - 1))->tt_)) & 0x0F)) == (4))";
LAB_00127437:
            __assert_fail(pcVar8,
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                          ,0x337,"void luaV_concat(lua_State *, int)");
          }
          p_Var2 = (p1->value_).f;
          if (((byte)p_Var2[8] & 0xf) != 4) {
            pcVar8 = "(((((top - n - 1)->value_).gc)->tt) & 0x0F) == 4";
            goto LAB_00127437;
          }
          if (p_Var2[8] == (_func_int_lua_State_ptr)0x4) {
            uVar5 = (ulong)(byte)p_Var2[0xb];
          }
          else {
            uVar5 = *(ulong *)(p_Var2 + 0x10);
          }
          if ((l ^ 0x7fffffffffffffff) <= uVar5) {
            luaG_runerror(L,"string length overflow");
          }
          l = l + uVar5;
          uVar10 = uVar10 + 1;
          p1 = p1 + -1;
        } while ((uint)total != uVar10);
        uVar10 = (ulong)(uint)total;
      }
LAB_001272f9:
      iVar9 = (int)uVar10;
      if (l < 0x29) {
        copy2buff(top,iVar9,acStack_58);
        pTVar6 = luaS_newlstr(L,acStack_58,l);
      }
      else {
        pTVar6 = luaS_createlngstrobj(L,l);
        copy2buff(top,iVar9,(char *)(pTVar6 + 1));
      }
      if (9 < (pTVar6->tt & 0xe)) {
        pcVar8 = "(((x_)->tt) & 0x0F) < (9+1)";
LAB_00127487:
        __assert_fail(pcVar8,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x345,"void luaV_concat(lua_State *, int)");
      }
      top[-(uVar10 & 0xffffffff)].value_.gc = (GCObject *)pTVar6;
      bVar1 = pTVar6->tt;
      top[-(uVar10 & 0xffffffff)].tt_ = bVar1 | 0x8000;
      if (((char)bVar1 < '\0') ||
         ((L != (lua_State *)0x0 && ((pTVar6->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))) {
        pcVar8 = "0";
        goto LAB_00127487;
      }
      iVar9 = iVar9 + -1;
    }
    else {
LAB_001271e4:
      luaT_trybinTM(L,p1,top + -1,p1,TM_CONCAT);
      iVar9 = 1;
    }
LAB_00127392:
    total = total - iVar9;
    top = L->top + -(long)iVar9;
    L->top = top;
    if (total < 2) {
      return;
    }
  } while( true );
}

Assistant:

void luaV_concat (lua_State *L, int total) {
  lua_assert(total >= 2);
  do {
    StkId top = L->top;
    int n = 2;  /* number of elements handled in this pass (at least 2) */
    if (!(ttisstring(top-2) || cvt2str(top-2)) || !tostring(L, top-1))
      luaT_trybinTM(L, top-2, top-1, top-2, TM_CONCAT);
    else if (isemptystr(top - 1))  /* second operand is empty? */
      cast_void(tostring(L, top - 2));  /* result is first operand */
    else if (isemptystr(top - 2)) {  /* first operand is an empty string? */
      setobjs2s(L, top - 2, top - 1);  /* result is second op. */
    }
    else {
      /* at least two non-empty string values; get as many as possible */
      size_t tl = vslen(top - 1);
      TString *ts;
      /* collect total length and number of strings */
      for (n = 1; n < total && tostring(L, top - n - 1); n++) {
        size_t l = vslen(top - n - 1);
        if (unlikely(l >= (MAX_SIZE/sizeof(char)) - tl))
          luaG_runerror(L, "string length overflow");
        tl += l;
      }
      if (tl <= LUAI_MAXSHORTLEN) {  /* is result a short string? */
        char buff[LUAI_MAXSHORTLEN];
        copy2buff(top, n, buff);  /* copy strings to buffer */
        ts = luaS_newlstr(L, buff, tl);
      }
      else {  /* long string; copy strings directly to final result */
        ts = luaS_createlngstrobj(L, tl);
        copy2buff(top, n, getstr(ts));
      }
      setsvalue2s(L, top - n, ts);  /* create result */
    }
    total -= n-1;  /* got 'n' strings to create 1 new */
    L->top -= n-1;  /* popped 'n' strings and pushed one */
  } while (total > 1);  /* repeat until only 1 result left */
}